

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O2

UDataMemory *
doLoadFromCommonData
          (UBool isICUData,char *param_2,char *param_3,char *param_4,char *tocEntryName,char *path,
          char *type,char *name,UDataMemoryIsAcceptable *isAcceptable,void *context,
          UErrorCode *subErrorCode,UErrorCode *pErrorCode)

{
  bool bVar1;
  int iVar2;
  UDataMemory *pUVar3;
  DataHeader *pHeader;
  UDataMemory *pUVar4;
  long lVar5;
  int commonDataIndex;
  Mutex local_90;
  char *local_88;
  char *local_80;
  UDataMemoryIsAcceptable *local_78;
  char *local_70;
  int32_t length;
  void *local_48;
  void *pvStack_40;
  
  commonDataIndex = -(uint)(isICUData == '\0');
  bVar1 = false;
  local_88 = param_4;
  local_80 = tocEntryName;
  local_78 = (UDataMemoryIsAcceptable *)path;
  local_70 = param_2;
  while( true ) {
    pUVar3 = openCommonData(param_3,commonDataIndex,(UErrorCode *)name);
    iVar2 = *(int *)name;
    if (pUVar3 != (UDataMemory *)0x0 && iVar2 < 1) {
      pHeader = (*pUVar3->vFuncs->Lookup)(pUVar3,local_70,&length,(UErrorCode *)name);
      if (pHeader != (DataHeader *)0x0) {
        pUVar4 = checkDataItem(pHeader,local_78,type,local_88,local_80,(UErrorCode *)name,
                               (UErrorCode *)isAcceptable);
        if (0 < *(int *)isAcceptable) {
          return (UDataMemory *)0x0;
        }
        if (pUVar4 != (UDataMemory *)0x0) {
          pUVar4->length = length;
          return pUVar4;
        }
      }
      iVar2 = *(int *)name;
    }
    if (iVar2 == 7) {
      *(undefined4 *)isAcceptable = 7;
      return (UDataMemory *)0x0;
    }
    if (isICUData == '\0') break;
    if (pUVar3 == (UDataMemory *)0x0) {
      if (bVar1) {
        return (UDataMemory *)0x0;
      }
      if (gHaveTriedToLoadCommonData.super___atomic_base<int>._M_i == 0) {
        pUVar3 = openCommonData("icudt63l",-1,(UErrorCode *)name);
        UDataMemory_init_63((UDataMemory *)&length);
        if (pUVar3 != (UDataMemory *)0x0) {
          UDatamemory_assign_63((UDataMemory *)&length,pUVar3);
          local_48 = (void *)0x0;
          pvStack_40 = (void *)0x0;
          setCommonICUData((UDataMemory *)&length,'\0',(UErrorCode *)name);
        }
        gHaveTriedToLoadCommonData.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
      }
      pUVar3 = udata_findCachedData("icudt63l",(UErrorCode *)name);
      if (pUVar3 == (UDataMemory *)0x0) {
        return (UDataMemory *)0x0;
      }
      if (0 < *(int *)name) {
        return (UDataMemory *)0x0;
      }
      local_90.fMutex = (UMutex *)0x0;
      umtx_lock_63((UMutex *)0x0);
      lVar5 = 0;
      while( true ) {
        if (lVar5 == 0x50) {
          icu_63::Mutex::~Mutex(&local_90);
          return (UDataMemory *)0x0;
        }
        if ((*(long *)((long)gCommonICUDataArray + lVar5) != 0) &&
           (*(DataHeader **)(*(long *)((long)gCommonICUDataArray + lVar5) + 8) == pUVar3->pHeader))
        break;
        lVar5 = lVar5 + 8;
      }
      icu_63::Mutex::~Mutex(&local_90);
      bVar1 = true;
    }
    else {
      commonDataIndex = commonDataIndex + 1;
    }
  }
  return (UDataMemory *)0x0;
}

Assistant:

static UDataMemory *doLoadFromCommonData(UBool isICUData, const char * /*pkgName*/, 
        const char * /*dataPath*/, const char * /*tocEntryPathSuffix*/, const char *tocEntryName,
            /* following arguments are the same as doOpenChoice itself */
            const char *path, const char *type, const char *name,
             UDataMemoryIsAcceptable *isAcceptable, void *context,
             UErrorCode *subErrorCode,
             UErrorCode *pErrorCode)
{
    UDataMemory        *pEntryData;
    const DataHeader   *pHeader;
    UDataMemory        *pCommonData;
    int32_t            commonDataIndex;
    UBool              checkedExtendedICUData = FALSE;
    /* try to get common data.  The loop is for platforms such as the 390 that do
     *  not initially load the full set of ICU data.  If the lookup of an ICU data item
     *  fails, the full (but slower to load) set is loaded, the and the loop repeats,
     *  trying the lookup again.  Once the full set of ICU data is loaded, the loop wont
     *  repeat because the full set will be checked the first time through.
     *
     *  The loop also handles the fallback to a .dat file if the application linked
     *   to the stub data library rather than a real library.
     */
    for (commonDataIndex = isICUData ? 0 : -1;;) {
        pCommonData=openCommonData(path, commonDataIndex, subErrorCode); /** search for pkg **/

        if(U_SUCCESS(*subErrorCode) && pCommonData!=NULL) {
            int32_t length;

            /* look up the data piece in the common data */
            pHeader=pCommonData->vFuncs->Lookup(pCommonData, tocEntryName, &length, subErrorCode);
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: pHeader=%p - %s\n", tocEntryName, pHeader, u_errorName(*subErrorCode));
#endif

            if(pHeader!=NULL) {
                pEntryData = checkDataItem(pHeader, isAcceptable, context, type, name, subErrorCode, pErrorCode);
#ifdef UDATA_DEBUG
                fprintf(stderr, "pEntryData=%p\n", pEntryData);
#endif
                if (U_FAILURE(*pErrorCode)) {
                    return NULL;
                }
                if (pEntryData != NULL) {
                    pEntryData->length = length;
                    return pEntryData;
                }
            }
        }
        // If we failed due to being out-of-memory, then stop early and report the error.
        if (*subErrorCode == U_MEMORY_ALLOCATION_ERROR) {
            *pErrorCode = *subErrorCode;
            return NULL;
        }
        /* Data wasn't found.  If we were looking for an ICUData item and there is
         * more data available, load it and try again,
         * otherwise break out of this loop. */
        if (!isICUData) {
            return NULL;
        } else if (pCommonData != NULL) {
            ++commonDataIndex;  /* try the next data package */
        } else if ((!checkedExtendedICUData) && extendICUData(subErrorCode)) {
            checkedExtendedICUData = TRUE;
            /* try this data package slot again: it changed from NULL to non-NULL */
        } else {
            return NULL;
        }
    }
}